

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
writeValueRankAttribute
          (UA_Server *server,UA_VariableNode *node,UA_Int32 valueRank,UA_Int32 constraintValueRank)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  UA_DataValue *in_R8;
  size_t arrayDimensionsSize;
  UA_String local_88;
  undefined8 local_78;
  long lStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((node->nodeClass == UA_NODECLASS_VARIABLETYPE) &&
     (UVar1 = UA_Node_hasSubTypeOrInstances((UA_Node *)node), UVar1)) {
    return 0x80020000;
  }
  switch(constraintValueRank) {
  case 0:
    if (valueRank < 0) {
      return 0x80740000;
    }
    break;
  case -3:
    if ((valueRank != -1) && (valueRank != 1)) {
      return 0x80740000;
    }
    break;
  case -2:
    break;
  case -1:
    if (valueRank != -1) {
      return 0x80740000;
    }
    break;
  default:
    if (valueRank != constraintValueRank) {
      return 0x80740000;
    }
  }
  arrayDimensionsSize = node->arrayDimensionsSize;
  if (arrayDimensionsSize == 0) {
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    lStack_70 = 0;
    local_88.length = 0;
    local_88.data = (UA_Byte *)0x0;
    UVar2 = readValueAttributeComplete
                      ((UA_Server *)node,(UA_VariableNode *)0x3,UA_TIMESTAMPSTORETURN_SOURCE,
                       &local_88,in_R8);
    if (UVar2 != 0) {
      return UVar2;
    }
    if ((local_68 == 0) || ((local_88.length & 1) == 0)) goto LAB_0011e79b;
    arrayDimensionsSize = (size_t)(local_68 < 2 || lStack_70 != 0);
    deleteMembers_noInit(&local_88,UA_TYPES + 0x16);
  }
  UVar2 = compatibleValueRankArrayDimensions(valueRank,arrayDimensionsSize);
  if (UVar2 != 0) {
    return UVar2;
  }
LAB_0011e79b:
  node->valueRank = valueRank;
  return 0;
}

Assistant:

UA_StatusCode
writeValueRankAttribute(UA_Server *server, UA_VariableNode *node, UA_Int32 valueRank,
                        UA_Int32 constraintValueRank) {
    /* If this is a variabletype, there must be no instances or subtypes of it
       when we do the change */
    if(node->nodeClass == UA_NODECLASS_VARIABLETYPE &&
       UA_Node_hasSubTypeOrInstances((const UA_Node*)node))
        return UA_STATUSCODE_BADINTERNALERROR;

    /* Check if the valuerank of the variabletype allows the change. */
    switch(constraintValueRank) {
    case -3: /* the value can be a scalar or a one dimensional array */
        if(valueRank != -1 && valueRank != 1)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    case -2: /* the value can be a scalar or an array with any number of dimensions */
        break;
    case -1: /* the value is a scalar */
        if(valueRank != -1)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    case 0: /* the value is an array with one or more dimensions */
        if(valueRank < 0)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    default: /* >= 1: the value is an array with the specified number of dimensions */
        if(valueRank != constraintValueRank)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    }

    /* Check if the new valuerank is compatible with the array dimensions. Use
     * the read service to handle data sources. */
    size_t arrayDims = node->arrayDimensionsSize;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(arrayDims == 0) {
        /* the value could be an array with no arrayDimensions defined.
           dimensions zero indicate a scalar for compatibleValueRankArrayDimensions. */
        UA_DataValue value;
        UA_DataValue_init(&value);
        retval = readValueAttribute(server, node, &value);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        if(!value.hasValue || value.value.data == NULL)
            goto apply; /* no value or null array */
        if(!UA_Variant_isScalar(&value.value))
            arrayDims = 1;
        UA_DataValue_deleteMembers(&value);
    }
    retval = compatibleValueRankArrayDimensions(valueRank, arrayDims);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* All good, apply the change */
 apply:
    node->valueRank = valueRank;
    return UA_STATUSCODE_GOOD;
}